

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

void PurgeApt(boundingBoxTy *_box)

{
  undefined8 uVar1;
  bool bVar2;
  iterator __position;
  string local_70;
  undefined8 local_50 [4];
  
  std::mutex::lock(&mtxGMapApt);
  __position._M_node = gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = boundingBoxTy::overlap((boundingBoxTy *)(__position._M_node + 3),_box);
    if (bVar2) {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
    else {
      if ((int)dataRefs.iLogLevel < 1) {
        std::__cxx11::string::string((string *)local_50,(string *)(__position._M_node + 2));
        uVar1 = local_50[0];
        boundingBoxTy::operator_cast_to_string(&local_70,(boundingBoxTy *)(__position._M_node + 3));
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0x948,"PurgeApt",logDEBUG,"apt.dat: Removed %s at %s",uVar1,
               local_70._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)local_50);
      }
      __position = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Apt>,std::_Select1st<std::pair<std::__cxx11::string_const,Apt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Apt>>>
                   ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Apt>,std::_Select1st<std::pair<std::__cxx11::string_const,Apt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Apt>>>
                                       *)&gmapApt_abi_cxx11_,__position);
    }
  }
  if ((int)dataRefs.iLogLevel < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp",
           0x94d,"PurgeApt",logDEBUG,"Done purging, %d airports left",
           (ulong)(uint)gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mtxGMapApt);
  return;
}

Assistant:

void PurgeApt (const boundingBoxTy& _box)
{
    // Access is guarded by a lock
    std::lock_guard<std::mutex> lock(mtxGMapApt);

    // loop all airports and remove those, whose center point is outside the box
    mapAptTy::iterator iter = gmapApt.begin();
    while (iter != gmapApt.end())
    {
        // Is airport still in box?
        Apt& apt = iter->second;
        if (apt.GetBounds().overlap(_box)) {
            // keep it, move on to next airport
            ++iter;
        } else {
            // remove it, move on to next airport
            LOG_MSG(logDEBUG, "apt.dat: Removed %s at %s",
                    apt.GetId().c_str(),
                    std::string(apt.GetBounds()).c_str());
            iter = gmapApt.erase(iter);
        }
    }
    
    LOG_MSG(logDEBUG, "Done purging, %d airports left", (int)gmapApt.size());
}